

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoMode.cpp
# Opt level: O0

vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> * sf::VideoMode::getFullscreenModes(void)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> *in_stack_ffffffffffffffc8;
  vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> *in_stack_ffffffffffffffd8;
  vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> *in_stack_ffffffffffffffe0;
  
  if ((getFullscreenModes()::modes == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getFullscreenModes()::modes), iVar2 != 0)) {
    std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::vector
              ((vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> *)0x23e61a);
    __cxa_atexit(std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::~vector,
                 &getFullscreenModes::modes,&__dso_handle);
    __cxa_guard_release(&getFullscreenModes()::modes);
  }
  bVar1 = std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::empty
                    (in_stack_ffffffffffffffe0);
  if (bVar1) {
    priv::VideoModeImpl::getFullscreenModes();
    std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::operator=
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::~vector(in_stack_ffffffffffffffe0);
    iVar3 = std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::begin
                      (in_stack_ffffffffffffffc8);
    iVar4 = std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::end
                      (in_stack_ffffffffffffffc8);
    std::
    sort<__gnu_cxx::__normal_iterator<sf::VideoMode*,std::vector<sf::VideoMode,std::allocator<sf::VideoMode>>>,std::greater<sf::VideoMode>>
              (iVar3._M_current,iVar4._M_current);
  }
  return &getFullscreenModes::modes;
}

Assistant:

const std::vector<VideoMode>& VideoMode::getFullscreenModes()
{
    static std::vector<VideoMode> modes;

    // Populate the array on first call
    if (modes.empty())
    {
        modes = priv::VideoModeImpl::getFullscreenModes();
        std::sort(modes.begin(), modes.end(), std::greater<VideoMode>());
    }

    return modes;
}